

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execAndiEa<(moira::Instr)10,(moira::Mode)3,(moira::Size)4>(Moira *this,u16 opcode)

{
  u16 uVar1;
  ushort uVar2;
  bool bVar3;
  u32 uVar4;
  uint uVar5;
  u32 data;
  u32 ea;
  uint local_30;
  u32 local_2c;
  
  uVar1 = (this->queue).irc;
  readExt(this);
  uVar2 = (this->queue).irc;
  readExt(this);
  bVar3 = readOp<(moira::Mode)3,(moira::Size)4,0ul>(this,opcode & 7,&local_2c,&local_30);
  if (bVar3) {
    uVar5 = CONCAT22(uVar1,uVar2) & local_30;
    (this->reg).sr.n = SUB41(uVar5 >> 0x1f,0);
    (this->reg).sr.z = uVar5 == 0;
    (this->reg).sr.v = false;
    (this->reg).sr.c = false;
    uVar4 = (this->reg).pc;
    (this->reg).pc0 = uVar4;
    (this->queue).ird = (this->queue).irc;
    uVar4 = readM<(moira::MemSpace)2,(moira::Size)2,0ul>(this,uVar4 + 2);
    (this->queue).irc = (u16)uVar4;
    writeM<(moira::MemSpace)1,(moira::Size)2,0ul>(this,local_2c + 2,local_30 & uVar2);
    writeM<(moira::MemSpace)1,(moira::Size)2,5ul>(this,local_2c,uVar5 >> 0x10);
  }
  return;
}

Assistant:

void
Moira::execAndiEa(u16 opcode)
{
    u32 ea, data, result;

    u32 src = readI<S>();
    int dst = _____________xxx(opcode);

    if (!readOp<M,S, STD_AE_FRAME>(dst, ea, data)) return;

    result = logic<I,S>(src, data);
    prefetch();

    writeOp <M,S, POLLIPL | REVERSE> (dst, ea, result);
}